

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O2

double cpu_idle_func(void)

{
  char *pcVar1;
  unsigned_long uVar2;
  double dVar3;
  double dVar4;
  sensor_slurp proc_stat;
  sensor_slurp local_2010;
  
  memcpy(&local_2010,&PTR_anon_var_dwarf_3c461_00162aa0,0x2008);
  pcVar1 = update_file(&local_2010);
  pcVar1 = skip_token(pcVar1);
  pcVar1 = skip_token(pcVar1);
  pcVar1 = skip_token(pcVar1);
  pcVar1 = skip_token(pcVar1);
  cpu_idle_func::idle_jiffies = strtod(pcVar1,(char **)0x0);
  uVar2 = total_jiffies_func();
  dVar3 = cpu_idle_func::idle_jiffies - cpu_idle_func::last_idle_jiffies;
  dVar4 = (double)(long)uVar2 - cpu_idle_func::last_total_jiffies;
  cpu_idle_func::last_idle_jiffies = cpu_idle_func::idle_jiffies;
  cpu_idle_func::last_total_jiffies = (double)(long)uVar2;
  return (double)(-(ulong)(dVar3 != 0.0) & (ulong)((dVar3 / dVar4) * 100.0));
}

Assistant:

double cpu_idle_func ( void )
{
    char *p;
    static double val; 
    static double last_idle_jiffies,  idle_jiffies,
	last_total_jiffies, total_jiffies, diff;
									   
      sensor_slurp proc_stat    = { "/proc/stat" };
    p = update_file(&proc_stat);
		      
    p = skip_token(p);
    p = skip_token(p);
    p = skip_token(p);
    p = skip_token(p);
    idle_jiffies  = strtod( p , (char **)NULL );
    total_jiffies = (double) total_jiffies_func();
		 
    diff = idle_jiffies - last_idle_jiffies;

    if ( diff ) 
	val = (diff/(total_jiffies - last_total_jiffies))*100;
    else 
	val = 0.0; 
    last_idle_jiffies = idle_jiffies;
    last_total_jiffies = total_jiffies;
    return val; 
}